

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall
ImDrawList::PathBezierCurveTo(ImDrawList *this,ImVec2 *p2,ImVec2 *p3,ImVec2 *p4,int num_segments)

{
  ImVec2 IVar1;
  ImVec2 IVar2;
  ImVec2 IVar3;
  int iVar4;
  ImVec2 *__src;
  ImVec2 IVar5;
  long lVar6;
  ImVec2 *__dest;
  int iVar7;
  int iVar8;
  int iVar9;
  bool bVar10;
  float x1;
  float y1;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  
  lVar6 = (long)(this->_Path).Size;
  if (lVar6 < 1) {
    __assert_fail("Size > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.h"
                  ,0x538,"T &ImVector<ImVec2>::back() [T = ImVec2]");
  }
  IVar1 = (this->_Path).Data[lVar6 + -1];
  x1 = IVar1.x;
  y1 = IVar1.y;
  if (num_segments == 0) {
    PathBezierToCasteljau
              (&this->_Path,x1,y1,p2->x,p2->y,p3->x,p3->y,p4->x,p4->y,
               this->_Data->CurveTessellationTol,0);
  }
  else if (0 < num_segments) {
    iVar8 = 1;
    do {
      fVar14 = (float)iVar8 * (1.0 / (float)num_segments);
      fVar12 = 1.0 - fVar14;
      IVar1 = *p2;
      IVar2 = *p3;
      IVar3 = *p4;
      iVar9 = (this->_Path).Size;
      iVar4 = (this->_Path).Capacity;
      if (iVar9 == iVar4) {
        if (iVar4 == 0) {
          iVar7 = 8;
        }
        else {
          iVar7 = iVar4 / 2 + iVar4;
        }
        iVar9 = iVar9 + 1;
        if (iVar9 < iVar7) {
          iVar9 = iVar7;
        }
        if (iVar4 < iVar9) {
          __dest = (ImVec2 *)ImGui::MemAlloc((long)iVar9 << 3);
          __src = (this->_Path).Data;
          if (__src != (ImVec2 *)0x0) {
            memcpy(__dest,__src,(long)(this->_Path).Size << 3);
            ImGui::MemFree((this->_Path).Data);
          }
          (this->_Path).Data = __dest;
          (this->_Path).Capacity = iVar9;
        }
      }
      fVar11 = fVar12 * fVar12 * fVar12;
      fVar13 = fVar12 * fVar12 * 3.0 * fVar14;
      fVar12 = fVar12 * 3.0 * fVar14 * fVar14;
      fVar14 = fVar14 * fVar14 * fVar14;
      IVar5.y = fVar14 * IVar3.y + fVar12 * IVar2.y + fVar11 * y1 + fVar13 * IVar1.y;
      IVar5.x = fVar14 * IVar3.x + fVar12 * IVar2.x + fVar11 * x1 + fVar13 * IVar1.x;
      (this->_Path).Data[(this->_Path).Size] = IVar5;
      (this->_Path).Size = (this->_Path).Size + 1;
      bVar10 = iVar8 != num_segments;
      iVar8 = iVar8 + 1;
    } while (bVar10);
  }
  return;
}

Assistant:

void ImDrawList::PathBezierCurveTo(const ImVec2& p2, const ImVec2& p3, const ImVec2& p4, int num_segments)
{
    ImVec2 p1 = _Path.back();
    if (num_segments == 0)
    {
        PathBezierToCasteljau(&_Path, p1.x, p1.y, p2.x, p2.y, p3.x, p3.y, p4.x, p4.y, _Data->CurveTessellationTol, 0); // Auto-tessellated
    }
    else
    {
        float t_step = 1.0f / (float)num_segments;
        for (int i_step = 1; i_step <= num_segments; i_step++)
            _Path.push_back(ImBezierCalc(p1, p2, p3, p4, t_step * i_step));
    }
}